

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

gc_heap_ptr<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,mjs::gc_heap&,unsigned_int&>
          (gc_heap *this,size_t num_bytes,gc_heap *args,uint *args_1)

{
  uint32_t uVar1;
  slot *psVar2;
  undefined8 extraout_RDX;
  uint32_t *in_R8;
  allocation_result aVar3;
  gc_heap_ptr<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table> gVar4;
  
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  psVar2 = aVar3.obj;
  if (*(int *)((long)psVar2 + -4) == -1) {
    uVar1 = *in_R8;
    *psVar2 = (slot)args_1;
    psVar2[1].new_position = uVar1;
    *(undefined4 *)((long)psVar2 + 0xc) = 0;
    *(undefined4 *)((long)psVar2 + -4) =
         gc_type_info_registration<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table>
         ::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar3.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table>)
           gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_vector<mjs::native_object::native_object_property>::gc_table, Args = <mjs::gc_heap &, unsigned int &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}